

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

uchar * mcmalo1(mcmcx1def *ctx,ushort siz,mcmon *nump)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  mcmon *pmVar4;
  mcmodef *pmVar5;
  undefined8 *puVar6;
  ushort uVar7;
  ushort n;
  uint uVar8;
  mcmon *pmVar9;
  ushort siz_00;
  mcmcx1def *pmVar10;
  undefined8 *puVar11;
  mcmon local_42;
  mcmon *local_40;
  mcmon *local_38;
  
  siz_00 = siz + 7 & 0xfff8;
  local_40 = nump;
  if (0x8000 < siz_00) {
    errsigf(ctx->mcmcxerr,"TADS",0x12);
  }
  pmVar9 = &ctx->mcmcxfre;
  pmVar10 = ctx;
  local_38 = pmVar9;
  do {
    uVar7 = *pmVar9;
    if (uVar7 != 0xffff) {
      puVar6 = (undefined8 *)0x0;
      uVar3 = 0xffff;
      do {
        uVar8 = uVar7 & 0xff;
        uVar2 = uVar7 >> 8;
        puVar11 = (undefined8 *)((long)&ctx->mcmcxtab[uVar2]->mcmoptr + (ulong)(uVar8 << 5));
        uVar1 = *(ushort *)((long)&ctx->mcmcxtab[uVar2]->mcmosiz + (ulong)(uVar8 << 5));
        n = uVar7;
        if (uVar1 == siz_00) goto LAB_0012c37b;
        n = uVar3;
        if ((siz_00 < uVar1) && ((uVar3 == 0xffff || (uVar1 < (ushort)pmVar10)))) {
          puVar6 = puVar11;
          pmVar10 = (mcmcx1def *)(ulong)uVar1;
          n = uVar7;
        }
        uVar7 = *(ushort *)(puVar11 + 2);
        uVar3 = n;
      } while (uVar7 != 0xffff);
      if (n != 0xffff) {
        uVar8 = (uint)(byte)n;
        uVar2 = n >> 8;
        puVar11 = puVar6;
LAB_0012c37b:
        mcmunl(ctx,n,local_38);
        *(byte *)((long)puVar11 + 0x14) = *(byte *)((long)puVar11 + 0x14) & 0x7f;
        *(undefined2 *)(puVar11 + 1) = 0xffff;
        mcmsplt(ctx,n,siz_00);
        *(undefined2 *)((long)&ctx->mcmcxtab[uVar2]->mcmoflg + (ulong)(uVar8 << 5)) = 0xe;
        (&ctx->mcmcxtab[uVar2]->mcmolcnt)[uVar8 << 5] = '\x01';
        *local_40 = n;
        return (uchar *)*puVar11;
      }
    }
    local_42 = 0xffff;
    pmVar4 = (mcmon *)mcmhalo(ctx);
    if (pmVar4 == (mcmon *)0x0) goto LAB_0012c35b;
    pmVar5 = mcmoal(ctx,&local_42);
    pmVar9 = local_38;
    if (local_42 == 0xffff) {
      ctx->mcmcxhpch = *(mcmhdef **)(pmVar4 + -4);
      free(pmVar4 + -4);
LAB_0012c35b:
      *local_40 = 0xffff;
      return (uchar *)0x0;
    }
    *pmVar4 = local_42;
    pmVar5->mcmoptr = (uchar *)(pmVar4 + 4);
    pmVar5->mcmosiz = 0x7ff8;
    pmVar5->mcmoflg = 0x80;
    pmVar10 = ctx;
    mcmlnkhd(ctx,local_38,local_42);
  } while( true );
}

Assistant:

static uchar *mcmalo1(mcmcx1def *ctx, ushort siz, mcmon *nump)
{
    mcmon    n;
    mcmodef *o;
    uchar   *chunk;
    
    MCMGLBCTX(ctx);

    /* round size to appropriate multiple */
    siz = osrndsz(siz);

    /* if it's bigger than the chunk size, we can't allocate it */
    if (siz > MCMCHUNK)
        errsig(ctx->mcmcxerr, ERR_BIGOBJ);

startover:
    /* look in the free block chain for a fit to the request */
    o = mcmffb(ctx, siz, &n);
    if (n != MCMONINV)
    {
        mcmsplt(ctx, n, siz);               /* split the block if necessary */
        mcmgobje(ctx, n)->mcmoflg = MCMOFNODISC | MCMOFLOCK | MCMOFPRES;
        mcmgobje(ctx, n)->mcmolcnt = 1;                /* one locker so far */
        *nump = n;
        return(o->mcmoptr);
    }
    
    /* nothing found; we must get space out of the heap if possible */
    chunk = mcmhalo(ctx);                            /* get space from heap */
    if (!chunk) goto error;           /* can't get any more space from heap */
    o = mcmoal(ctx, &n);               /* set up cache entry for free space */
    if (n == MCMONINV)
    {
        mcmhdef *chunk_hdr = ((mcmhdef *)chunk) - 1;
        ctx->mcmcxhpch = chunk_hdr->mcmhnxt;
        mchfre(chunk_hdr);
        goto error;         /* any error means we can't allocate the memory */
    }
    
    *(mcmon *)chunk = n;                               /* set object header */
    chunk += osrndsz(sizeof(mcmon));
    o->mcmoptr = chunk;
    o->mcmosiz = MCMCHUNK - osrndsz(sizeof(mcmon));
    o->mcmoflg = MCMOFFREE;
    mcmlnkhd(ctx, &ctx->mcmcxfre, n);
    goto startover;              /* try again, now that we have some memory */
    
error:
    *nump = MCMONINV;
    return((uchar *)0);
}